

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int fits_make_histde(fitsfile *fptr,fitsfile *histptr,int *datatypes,int bitpix,int naxis,
                    long *naxes,int *colnum,char **colexpr,double *amin,double *amax,double *binsize
                    ,double weight,int wtcolnum,char *wtexpr,int recip,char *selectrow,int *status)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  ParseData *lParse;
  int in_ECX;
  long in_RDX;
  fitsfile *in_RSI;
  fitsfile *in_RDI;
  int in_R8D;
  long in_R9;
  bool bVar4;
  double in_XMM0_Qa;
  undefined4 *in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  int wtdatatype_1;
  int jj_1;
  long wtnaxes [5];
  int wtnaxis;
  int wtdatatype;
  int jj;
  long naxes_1 [5];
  long nelem;
  int naxis1;
  int datatype_1;
  int datatype;
  long colrepeat;
  long wtrepeat;
  long repeat;
  double double_nulval;
  iteratorCol *iterCols;
  int numIterCols;
  int startCol;
  int numAllocCols;
  parseInfo infos [5];
  ParseData parsers [5];
  long nrows;
  iteratorCol imagepars [1];
  histType histData;
  double maxbin [4];
  double tbin [4];
  double tmax [4];
  double tmin [4];
  double taxes [4];
  long n_per_loop;
  long offset;
  long ibin;
  long imax;
  long imin;
  int n_cols;
  int imagetype;
  int ii;
  int *piVar5;
  ParseData *in_stack_fffffffffffff460;
  fitsfile *in_stack_fffffffffffff468;
  fitsfile *fptr_00;
  parseInfo *in_stack_fffffffffffff470;
  parseInfo *Info;
  ParseData *in_stack_fffffffffffff478;
  undefined4 in_stack_fffffffffffff480;
  undefined4 in_stack_fffffffffffff484;
  int in_stack_fffffffffffff48c;
  fitsfile *in_stack_fffffffffffff490;
  int local_b44;
  undefined4 in_stack_fffffffffffff4c0;
  undefined4 in_stack_fffffffffffff4c4;
  fitsfile *in_stack_fffffffffffff4c8;
  int in_stack_fffffffffffff4d4;
  fitsfile *in_stack_fffffffffffff4d8;
  long *in_stack_fffffffffffff4e0;
  int *in_stack_fffffffffffff4e8;
  int in_stack_fffffffffffff4f4;
  int *in_stack_fffffffffffff4f8;
  int in_stack_fffffffffffff504;
  int in_stack_fffffffffffff508;
  int in_stack_fffffffffffff50c;
  int *local_af0;
  int *local_ae8;
  int *naxis_00;
  iteratorCol *naxes_00;
  int in_stack_fffffffffffff538;
  undefined4 uVar6;
  int local_ac0;
  undefined1 local_ab8 [504];
  void *in_stack_fffffffffffff740;
  _func_int_long_long_long_long_int_iteratorCol_ptr_void_ptr *in_stack_fffffffffffff748;
  long in_stack_fffffffffffff750;
  long in_stack_fffffffffffff758;
  iteratorCol *in_stack_fffffffffffff760;
  int in_stack_fffffffffffff768;
  int *in_stack_fffffffffffff780;
  fitsfile local_7e8 [6];
  int aiStack_788 [16];
  long alStack_748 [96];
  fitsfile afStack_448 [6];
  int local_3e8;
  long local_3a8;
  undefined8 local_360;
  iteratorCol local_358;
  undefined1 local_248 [8];
  fitsfile *local_240;
  int local_238;
  undefined4 local_234;
  undefined4 local_230;
  undefined4 local_22c;
  undefined4 local_228;
  int local_224;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  double local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  double local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  double local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  long local_198;
  long local_190;
  long local_188;
  double local_168;
  int *local_150;
  int aiStack_148 [5];
  int local_134;
  ParseData *local_130;
  fitsfile *local_128;
  undefined1 *local_120;
  double local_118 [4];
  double local_f8 [4];
  double adStack_d8 [4];
  double local_b8 [4];
  double local_98 [4];
  undefined8 local_78;
  undefined8 local_70;
  long local_68;
  long local_60;
  long local_58;
  undefined4 local_4c;
  int local_48;
  int local_44;
  double local_40;
  long local_38;
  int local_30;
  int local_2c;
  long local_28;
  fitsfile *local_20;
  fitsfile *local_18;
  
  local_4c = 1;
  local_70 = 0;
  local_78 = 0xffffffffffffffff;
  local_360 = 0xffffffffffffffff;
  uVar6 = 0;
  naxes_00 = (iteratorCol *)0xb8a83e285ebab4b7;
  naxis_00 = (int *)0x0;
  local_ae8 = (int *)0x0;
  if (0 < *(int *)wtnaxes[4]) {
    return *(int *)wtnaxes[4];
  }
  local_40 = in_XMM0_Qa;
  local_38 = in_R9;
  local_30 = in_R8D;
  local_2c = in_ECX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  memset(local_ab8,0,0x2d0);
  memset(local_7e8,0,0x488);
  memset(local_248,0,0x130);
  if (4 < local_30) {
    ffpmsg((char *)0x1d8f58);
    *(undefined4 *)wtnaxes[4] = 0x140;
    return 0x140;
  }
  if (local_2c == 8) {
    local_48 = 0xb;
  }
  else if (local_2c == 0x10) {
    local_48 = 0x15;
  }
  else if (local_2c == 0x20) {
    local_48 = 0x1f;
  }
  else if (local_2c == -0x20) {
    local_48 = 0x2a;
  }
  else {
    if (local_2c != -0x40) {
      *(undefined4 *)wtnaxes[4] = 0x19a;
      return 0x19a;
    }
    local_48 = 0x52;
  }
  if (local_18->HDUposition != local_18->Fptr->curhdu) {
    ffmahd(in_stack_fffffffffffff4d8,in_stack_fffffffffffff4d4,
           &in_stack_fffffffffffff4c8->HDUposition,
           (int *)CONCAT44(in_stack_fffffffffffff4c4,in_stack_fffffffffffff4c0));
  }
  if ((((0 < (int)wtnaxes[0]) || ((wtnaxes[1] != 0 && (*(char *)wtnaxes[1] != '\0')))) &&
      (local_40 == 0.0)) && (!NAN(local_40))) {
    local_40 = -9.1191291391491e-36;
  }
  local_168 = local_40;
  local_240 = local_18;
  local_224 = local_48;
  local_238 = local_30;
  lParse = (ParseData *)
           fits_recalloc(in_stack_fffffffffffff478,(size_t)in_stack_fffffffffffff470,
                         (size_t)in_stack_fffffffffffff468,(size_t)in_stack_fffffffffffff460);
  if (lParse == (ParseData *)0x0) {
    ffpmsg((char *)0x1d915a);
    *(undefined4 *)wtnaxes[4] = 0x71;
    goto LAB_001d9f73;
  }
  for (local_44 = 0; local_44 < 5; local_44 = local_44 + 1) {
    aiStack_148[local_44] = -1;
  }
  local_ac0 = 0;
  for (local_44 = 0; local_44 < local_30; local_44 = local_44 + 1) {
    local_af0 = (int *)0x0;
    aiStack_148[local_44] = local_ac0;
    local_98[local_44] = (double)*(long *)(local_38 + (long)local_44 * 8);
    local_b8[local_44] = *(double *)(in_stack_00000018 + (long)local_44 * 8);
    adStack_d8[local_44] = *(double *)(in_stack_00000020 + (long)local_44 * 8);
    dVar2 = *(double *)(in_stack_00000018 + (long)local_44 * 8);
    pdVar1 = (double *)(in_stack_00000020 + (long)local_44 * 8);
    if (((*pdVar1 <= dVar2 && dVar2 != *pdVar1) &&
        (0.0 < *(double *)(_wtdatatype_1 + (long)local_44 * 8))) ||
       ((*(double *)(in_stack_00000018 + (long)local_44 * 8) <
         *(double *)(in_stack_00000020 + (long)local_44 * 8) &&
        (pdVar1 = (double *)(_wtdatatype_1 + (long)local_44 * 8), *pdVar1 <= 0.0 && *pdVar1 != 0.0))
       )) {
      local_f8[local_44] = -*(double *)(_wtdatatype_1 + (long)local_44 * 8);
    }
    else {
      local_f8[local_44] = *(double *)(_wtdatatype_1 + (long)local_44 * 8);
    }
    local_58 = (long)local_b8[local_44];
    local_60 = (long)adStack_d8[local_44];
    local_68 = (long)local_f8[local_44];
    if (((in_stack_00000010 == 0) || (*(long *)(in_stack_00000010 + (long)local_44 * 8) == 0)) ||
       (**(char **)(in_stack_00000010 + (long)local_44 * 8) == '\0')) {
      ffeqty(in_stack_fffffffffffff490,in_stack_fffffffffffff48c,
             (int *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
             (long *)in_stack_fffffffffffff478,(long *)in_stack_fffffffffffff470,
             &in_stack_fffffffffffff468->HDUposition);
    }
    if ((local_28 != 0) && (*(int *)(local_28 + (long)local_44 * 4) != 0)) {
      in_stack_fffffffffffff50c = *(int *)(local_28 + (long)local_44 * 4);
    }
    if (((0x29 < in_stack_fffffffffffff50c) || ((double)local_58 != local_b8[local_44])) ||
       ((NAN((double)local_58) || NAN(local_b8[local_44]) ||
        (((((double)local_60 != adStack_d8[local_44] ||
           (NAN((double)local_60) || NAN(adStack_d8[local_44]))) ||
          ((double)local_68 != local_f8[local_44])) ||
         (NAN((double)local_68) || NAN(local_f8[local_44]))))))) {
      local_118[local_44] = (adStack_d8[local_44] - local_b8[local_44]) / local_f8[local_44];
    }
    else {
      local_118[local_44] = local_98[local_44] + 1.0;
      if (adStack_d8[local_44] <= local_b8[local_44]) {
        local_b8[local_44] = local_b8[local_44] + 0.5;
        adStack_d8[local_44] = adStack_d8[local_44] - 0.5;
      }
      else {
        local_b8[local_44] = local_b8[local_44] - 0.5;
        adStack_d8[local_44] = adStack_d8[local_44] + 0.5;
      }
    }
    if (((in_stack_00000010 == 0) || (*(long *)(in_stack_00000010 + (long)local_44 * 8) == 0)) ||
       (**(char **)(in_stack_00000010 + (long)local_44 * 8) == '\0')) {
      fits_iter_set_by_num
                ((iteratorCol *)((long)lParse + (long)local_ac0 * 0x110),local_18,
                 in_stack_00000008[local_44],0x52,0);
      local_ac0 = local_ac0 + 1;
    }
    else {
      in_stack_fffffffffffff460 = (ParseData *)&stack0xfffffffffffff4c8;
      in_stack_fffffffffffff468 = (fitsfile *)((long)local_7e8 + (long)local_44 * 0xe8);
      piVar5 = (int *)&stack0xfffffffffffff504;
      in_stack_fffffffffffff470 = (parseInfo *)wtnaxes[4];
      ffiprs((fitsfile *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
             in_stack_fffffffffffff504,(char *)in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f4,
             in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,naxis_00,(long *)naxes_00,lParse,
             (int *)CONCAT44(uVar6,in_stack_fffffffffffff538));
      if (*(int *)wtnaxes[4] != 0) goto LAB_001d9f73;
      local_af0 = in_stack_fffffffffffff4f8;
      if ((long)in_stack_fffffffffffff4f8 < 0) {
        local_af0 = (int *)0x1;
      }
      in_stack_fffffffffffff4f8 = local_af0;
      ffgnrw(in_stack_fffffffffffff468,(long *)in_stack_fffffffffffff460,piVar5);
      iVar3 = fits_parser_set_temporary_col
                        (in_stack_fffffffffffff478,in_stack_fffffffffffff470,
                         (long)in_stack_fffffffffffff468,in_stack_fffffffffffff460,piVar5);
      if (iVar3 != 0) goto LAB_001d9f73;
      lParse = (ParseData *)
               fits_recalloc(in_stack_fffffffffffff478,(size_t)in_stack_fffffffffffff470,
                             (size_t)in_stack_fffffffffffff468,(size_t)in_stack_fffffffffffff460);
      if (lParse == (ParseData *)0x0) {
        *(undefined4 *)wtnaxes[4] = 0x71;
        goto LAB_001d9f73;
      }
      for (iVar3 = 0; iVar3 < aiStack_788[(long)local_44 * 0x3a]; iVar3 = iVar3 + 1) {
        memcpy((void *)((long)lParse + (long)local_ac0 * 0x110),
               (void *)(alStack_748[(long)local_44 * 0x1d] + (long)iVar3 * 0x110),0x110);
        local_ac0 = local_ac0 + 1;
      }
    }
    if ((naxis_00 != (int *)0x0) && (bVar4 = naxis_00 != local_af0, local_af0 = naxis_00, bVar4)) {
      ffpmsg((char *)0x1d9964);
      *(undefined4 *)wtnaxes[4] = 0x140;
      goto LAB_001d9f73;
    }
    naxis_00 = local_af0;
  }
  if ((((wtnaxes[1] == 0) || (*(char *)wtnaxes[1] == '\0')) || (local_40 != -9.1191291391491e-36))
     || (NAN(local_40))) {
    piVar5 = naxis_00;
    if ((local_40 == -9.1191291391491e-36) && (!NAN(local_40))) {
      ffeqty(in_stack_fffffffffffff490,in_stack_fffffffffffff48c,
             (int *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480),
             (long *)in_stack_fffffffffffff478,(long *)in_stack_fffffffffffff470,
             &in_stack_fffffffffffff468->HDUposition);
      aiStack_148[4] = local_ac0;
      fits_iter_set_by_num
                ((iteratorCol *)((long)lParse + (long)local_ac0 * 0x110),local_18,(int)wtnaxes[0],
                 0x52,0);
      local_ac0 = local_ac0 + 1;
      piVar5 = local_ae8;
    }
  }
  else {
    aiStack_148[4] = local_ac0;
    in_stack_fffffffffffff460 = (ParseData *)&stack0xfffffffffffff488;
    fptr_00 = afStack_448;
    piVar5 = &local_b44;
    Info = (parseInfo *)wtnaxes[4];
    ffiprs((fitsfile *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
           in_stack_fffffffffffff504,(char *)in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f4,
           in_stack_fffffffffffff4e8,in_stack_fffffffffffff4e0,naxis_00,(long *)naxes_00,lParse,
           (int *)CONCAT44(uVar6,in_stack_fffffffffffff538));
    if (*(int *)wtnaxes[4] != 0) goto LAB_001d9f73;
    local_ae8 = (int *)0x0;
    ffgnrw(fptr_00,(long *)in_stack_fffffffffffff460,piVar5);
    iVar3 = fits_parser_set_temporary_col
                      (in_stack_fffffffffffff478,Info,(long)fptr_00,in_stack_fffffffffffff460,piVar5
                      );
    if (iVar3 != 0) goto LAB_001d9f73;
    lParse = (ParseData *)
             fits_recalloc(in_stack_fffffffffffff478,(size_t)Info,(size_t)fptr_00,
                           (size_t)in_stack_fffffffffffff460);
    if (lParse == (ParseData *)0x0) {
      *(undefined4 *)wtnaxes[4] = 0x71;
      goto LAB_001d9f73;
    }
    for (iVar3 = 0; piVar5 = local_ae8, iVar3 < local_3e8; iVar3 = iVar3 + 1) {
      memcpy((void *)((long)lParse + (long)local_ac0 * 0x110),
             (void *)(local_3a8 + (long)iVar3 * 0x110),0x110);
      local_ac0 = local_ac0 + 1;
    }
  }
  local_ae8 = piVar5;
  if (((local_ae8 == (int *)0x0) || (naxis_00 == (int *)0x0)) || (local_ae8 == naxis_00)) {
    local_134 = local_ac0;
    local_128 = local_7e8;
    local_120 = local_ab8;
    local_234 = *in_stack_00000008;
    local_200 = local_b8[0];
    local_1e0 = local_118[0];
    local_1c0 = local_f8[0];
    local_220 = (long)local_98[0];
    local_1a0 = 1;
    if (1 < local_238) {
      local_230 = in_stack_00000008[1];
      local_1f8 = local_b8[1];
      local_1d8 = local_118[1];
      local_1b8 = local_f8[1];
      local_218 = (long)local_98[1];
      local_198 = local_220;
      if (2 < local_238) {
        local_22c = in_stack_00000008[2];
        local_1f0 = local_b8[2];
        local_1d0 = local_118[2];
        local_1b0 = local_f8[2];
        local_210 = (long)local_98[2];
        local_190 = local_220 * local_218;
        if (3 < local_238) {
          local_228 = in_stack_00000008[3];
          local_1e8 = local_b8[3];
          local_1c8 = local_118[3];
          local_1a8 = local_f8[3];
          local_208 = (long)local_98[3];
          local_188 = local_190 * local_210;
        }
      }
    }
    local_150 = naxis_00;
    local_130 = lParse;
    fits_iter_set_file(&local_358,local_20);
    fits_iter_set_datatype(&local_358,local_48);
    fits_iter_set_iotype(&local_358,2);
    ffiter(in_stack_fffffffffffff768,in_stack_fffffffffffff760,in_stack_fffffffffffff758,
           in_stack_fffffffffffff750,in_stack_fffffffffffff748,in_stack_fffffffffffff740,
           in_stack_fffffffffffff780);
  }
  else {
    ffpmsg((char *)0x1d9ca2);
    *(undefined4 *)wtnaxes[4] = 0x140;
  }
LAB_001d9f73:
  if (lParse != (ParseData *)0x0) {
    free(lParse);
  }
  for (local_44 = 0; local_44 < 5; local_44 = local_44 + 1) {
    if (0 < aiStack_788[(long)local_44 * 0x3a]) {
      ffcprs(in_stack_fffffffffffff460);
    }
  }
  return *(int *)wtnaxes[4];
}

Assistant:

int fits_make_histde(fitsfile *fptr, /* IO - pointer to table with X and Y cols; */
    fitsfile *histptr, /* I - pointer to output FITS image      */
    int *datatypes,   /*  I - datatype of input (or 0 for auto) */
    int bitpix,       /* I - datatype for image: 16, 32, -32, etc    */
    int naxis,        /* I - number of axes in the histogram image   */
    long *naxes,      /* I - size of axes in the histogram image   */
    int *colnum,      /* I - column numbers (array length = naxis)   */
    char *colexpr[4], /* I - optional expression instead of column */
    double *amin,     /* I - minimum histogram value, for each axis */
    double *amax,     /* I - maximum histogram value, for each axis */
    double *binsize,  /* I - bin size along each axis               */
    double weight,    /* I - binning weighting factor (0 or DOUBLENULLVALUE means null) */
    int wtcolnum,     /* I - optional keyword or col for weight*/
    char *wtexpr,     /* I - optional weighting expression */
		      /*  disambiguation of weight values */
		      /*    non-null weight: use that value */
		      /*    null weight: use wtexpr if non-null, else wtcolnum */
    int recip,              /* I - use reciprocal of the weight?     */
    char *selectrow,        /* I - optional array (length = no. of   */
                             /* rows in the table).  If the element is true */
                             /* then the corresponding row of the table will*/
                             /* be included in the histogram, otherwise the */
                             /* row will be skipped.  Ingnored if *selectrow*/
                             /* is equal to NULL.                           */
    int *status)
{		  
    int ii, imagetype;
    int n_cols = 1;
    long imin, imax, ibin;
    long  offset = 0;
    long n_per_loop = -1;  /* force whole array to be passed at one time */
    double taxes[4], tmin[4], tmax[4], tbin[4], maxbin[4];
    histType histData;    /* Structure holding histogram info for iterator */
    iteratorCol imagepars[1];
    long nrows = -1;
    ParseData parsers[5];
    parseInfo infos[5];
    int numAllocCols = 0, startCol = -1, numIterCols = 0;
    iteratorCol *iterCols = 0;
    double double_nulval = DOUBLENULLVALUE;
    long repeat = 0, wtrepeat = 0;

    /* check inputs */
    
    if (*status > 0)
        return(*status);

    /* Make sure the parser information is initialized because we will
       use this to determine what needs to be deallocated at the end */
    memset(infos, 0, sizeof(infos));
    memset(parsers, 0, sizeof(parsers));
    memset(&histData, 0, sizeof(histData));

    if (naxis > 4)
    {
        ffpmsg("histogram has more than 4 dimensions");
        return(*status = BAD_DIMEN);
    }

    if   (bitpix == BYTE_IMG)
         imagetype = TBYTE;
    else if (bitpix == SHORT_IMG)
         imagetype = TSHORT;
    else if (bitpix == LONG_IMG)
         imagetype = TINT;    
    else if (bitpix == FLOAT_IMG)
         imagetype = TFLOAT;    
    else if (bitpix == DOUBLE_IMG)
         imagetype = TDOUBLE;    
    else
        return(*status = BAD_DATATYPE);

    /* reset position to the correct HDU if necessary */
    if ((fptr)->HDUposition != ((fptr)->Fptr)->curhdu)
        ffmahd(fptr, ((fptr)->HDUposition) + 1, NULL, status);

    /* Resolve the conflict between wtexpr, wtcolnum, and weight */
    if ( ((wtcolnum > 0) || (wtexpr && wtexpr[0])) && weight == 0 ) weight = DOUBLENULLVALUE;
    histData.weight     = weight;
    histData.wtcolnum   = wtcolnum;
    histData.wtexpr     = wtexpr;
    histData.wtrecip    = recip;
    histData.tblptr     = fptr;
    histData.himagetype = imagetype;
    histData.haxis      = naxis;
    histData.rowselector = selectrow;

    /* Now make iterator columns for input, as well as any calculated values */
    numAllocCols = 5;
    iterCols = fits_recalloc(0, 0, numAllocCols, sizeof(iteratorCol));
    if (!iterCols) {
      ffpmsg("memory allocation failure (fits_make_histde)");
      *status = MEMORY_ALLOCATION;
      goto cleanup;
    }

    /* We fill the iterCols in order, starting from column 1 through 4, and 
       then moving on to the weighting column */
    for (ii = 0; ii < 5; ii++)  histData.startCols[ii] = -1;
    startCol = 0;

    /* Loop through each axis and recheck the binning parameters */
    for (ii = 0; ii < naxis; ii++)
    {
      long colrepeat = 0;
      int datatype;
      histData.startCols[ii] = startCol;

      taxes[ii] = (double) naxes[ii];
      tmin[ii] = amin[ii];
      tmax[ii] = amax[ii];
      if ( (amin[ii] > amax[ii] && binsize[ii] > 0. ) ||
           (amin[ii] < amax[ii] && binsize[ii] < 0. ) )
          tbin[ii] =  -binsize[ii];  /* reverse the sign of binsize */
      else
          tbin[ii] =   binsize[ii];  /* binsize has the correct sign */
          
      imin = (long) tmin[ii];
      imax = (long) tmax[ii];
      ibin = (long) tbin[ii];
    
      /* get the datatype of the column and repeat */
      if (! (colexpr && colexpr[ii] && colexpr[ii][0]) ) {
	fits_get_eqcoltype(fptr, colnum[ii], &datatype, &colrepeat, NULL, status);
      }

      /* If caller specified datatype, use that */
      if (datatypes && datatypes[ii]) {
	datatype = datatypes[ii];
      }

      if (datatype <= TLONG && (double) imin == tmin[ii] &&
                               (double) imax == tmax[ii] &&
                               (double) ibin == tbin[ii] )
      {
        /* This is an integer column and integer limits were entered. */
        /* Shift the lower and upper histogramming limits by 0.5, so that */
        /* the values fall in the center of the bin, not on the edge. */

        maxbin[ii] = (taxes[ii] + 1.F);  /* add 1. instead of .5 to avoid roundoff */

        if (tmin[ii] < tmax[ii])
        {
          tmin[ii] = tmin[ii] - 0.5F;
          tmax[ii] = tmax[ii] + 0.5F;
        }
        else
        {
          tmin[ii] = tmin[ii] + 0.5F;
          tmax[ii] = tmax[ii] - 0.5F;
        }
      } else {  /* not an integer column with integer limits */
          maxbin[ii] = (tmax[ii] - tmin[ii]) / tbin[ii]; 
      }

      /* This is a column expression.  Here is where we allocate the 
	 parser for it during the actual evaluation. */
      if (colexpr && colexpr[ii] && colexpr[ii][0]) {
	int datatype, naxis1;
	long nelem, naxes[MAXDIMS];
	int jj;

	/* Initialize the parser for this binning expression */
	ffiprs( fptr, 0, colexpr[ii], MAXDIMS, &datatype, &nelem, &naxis1,
		naxes, &(parsers[ii]), status );
	if (*status) goto cleanup;
	if (nelem < 0) nelem = 1; /* If it's a constant expression */

	colrepeat = nelem;

	/* Set up the parser data for evaluation to a TemporaryCol */
	fits_get_num_rows(fptr, &nrows, status);
	if (fits_parser_set_temporary_col(&(parsers[ii]), &(infos[ii]), nrows,
					  (void *) &(double_nulval), status)) goto cleanup;

	/* Copy iterator columns from the parser to the master iterator columns */
	iterCols = fits_recalloc(iterCols, numAllocCols, numAllocCols+parsers[ii].nCols,
			    sizeof(iteratorCol));
	if (!iterCols) {
	  *status = MEMORY_ALLOCATION;
	  goto cleanup;
	}
	numAllocCols += parsers[ii].nCols;
	for (jj = 0; jj < parsers[ii].nCols; jj++) iterCols[startCol++] = parsers[ii].colData[jj];

      } else {

	/* Just a "regular" column name, we already have enough allocated for these */
	fits_iter_set_by_num(&(iterCols[startCol]), fptr, colnum[ii], TDOUBLE, InputCol);
	startCol ++;
      }

      /* Check that all the vector dimensions agree */
      if (repeat == 0) {
	repeat = colrepeat;
      } else {
	if (repeat != colrepeat) {
	  ffpmsg("vector dimensions of binning values do not agree");
	  *status = BAD_DIMEN;
	  goto cleanup;
	}
      }

    } /* End of loop over columns */

    /* Now initialize the iterator column data for the weighting */
    if (wtexpr && wtexpr[0] && weight == DOUBLENULLVALUE) {
      int wtdatatype, wtnaxis;
      long wtnaxes[MAXDIMS];
      int jj;

      histData.startCols[4] = startCol;
      ffiprs( fptr, 0, wtexpr, MAXDIMS, &wtdatatype, &wtrepeat, &wtnaxis,
	      wtnaxes, &(parsers[4]), status );
      if (*status) goto cleanup;
      if (wtrepeat < 0) wtrepeat = 1; /* If it's a constant expression */

      /* Set up the parser data for evaluation to a TemporaryCol */
      /* It's a weighting expression, set that up and ... */
      fits_get_num_rows(fptr, &nrows, status);
      if (fits_parser_set_temporary_col(&(parsers[4]), &(infos[4]), nrows,
					(void *) &(double_nulval), status)) goto cleanup;

      /* Copy iterator columns from the parser to the master iterator columns */
      iterCols = fits_recalloc(iterCols, numAllocCols, numAllocCols+parsers[4].nCols,
			  sizeof(iteratorCol));
      if (!iterCols) {
	*status = MEMORY_ALLOCATION;
	goto cleanup;
      }
      numAllocCols += parsers[ii].nCols;
      for (jj = 0; jj < parsers[4].nCols; jj++) iterCols[startCol++] = parsers[4].colData[jj];

    } else if (weight == DOUBLENULLVALUE) {
      int wtdatatype;

      /* It's a "regular" weighting column */
      fits_get_eqcoltype(fptr, wtcolnum, &wtdatatype, &wtrepeat, NULL, status);

      histData.startCols[4] = startCol;
      fits_iter_set_by_num(&(iterCols[startCol]), fptr, wtcolnum, TDOUBLE, InputCol);
      startCol ++;
    } else {

      /* In case of explicit numerical value, we can just use that number
	 in the vector expression, so the vector repeat of the weighting can
	 be set to that of the input */
      wtrepeat = repeat;
    }

    /* Vector dimension of weighting must agree with binning */
    if (wtrepeat != 0 && repeat != 0 && wtrepeat != repeat) {
      ffpmsg("vector dimensions of weights do not agree with bins");
      *status = BAD_DIMEN;
      goto cleanup;
    }

    /* We now know he number of iterator columns */
    numIterCols = startCol;

    /* Fill in iterator information for the parser*/
    histData.numIterCols = numIterCols;
    histData.iterCols = iterCols;
    histData.parsers = parsers;
    histData.infos = infos;
    histData.repeat = repeat;

    /* Set global variables with histogram parameter values.    */
    /* Use separate scalar variables rather than arrays because */
    /* it is more efficient when computing the histogram.       */

    histData.hcolnum[0]  = colnum[0];
    histData.amin1 = tmin[0];
    histData.maxbin1 = maxbin[0];
    histData.binsize1 = tbin[0];
    histData.haxis1 = (long) taxes[0];
    histData.incr[0] = 1;

    if (histData.haxis > 1)
    {
      histData.hcolnum[1]  = colnum[1];
      histData.amin2 = tmin[1];
      histData.maxbin2 = maxbin[1];
      histData.binsize2 = tbin[1];
      histData.haxis2 = (long) taxes[1];
      histData.incr[1] = histData.incr[0] * histData.haxis1;

      if (histData.haxis > 2)
      {
        histData.hcolnum[2]  = colnum[2];
        histData.amin3 = tmin[2];
        histData.maxbin3 = maxbin[2];
        histData.binsize3 = tbin[2];
        histData.haxis3 = (long) taxes[2];
	histData.incr[2] = histData.incr[1] * histData.haxis2;

        if (histData.haxis > 3)
        {
          histData.hcolnum[3]  = colnum[3];
          histData.amin4 = tmin[3];
          histData.maxbin4 = maxbin[3];
          histData.binsize4 = tbin[3];
          histData.haxis4 = (long) taxes[3];
	  histData.incr[3] = histData.incr[2] * histData.haxis3;
        }
      }
    }

    /* define parameters of image for the iterator function */
    fits_iter_set_file(imagepars, histptr);        /* pointer to image */
    fits_iter_set_datatype(imagepars, imagetype);  /* image datatype   */
    fits_iter_set_iotype(imagepars, OutputCol);    /* image is output  */

    /* call the iterator function to write out the histogram image */
    fits_iterate_data(n_cols, imagepars, offset, n_per_loop,
                          ffwritehisto, (void*)&histData, status);
       
 cleanup:
    /* Free any allocated memory ... */
    if (iterCols) free(iterCols);
    /* ... and parsers */
    for (ii = 0; ii <= 4; ii ++) {
      if (parsers[ii].nCols > 0) ffcprs(&(parsers[ii]));
    }
    return(*status);
}